

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O1

void __thiscall xmrig::OclConfig::generate(OclConfig *this)

{
  int iVar1;
  const_iterator cVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var3;
  size_t sVar4;
  ulong uVar5;
  ulong __n;
  OclDevice *device;
  pointer __args;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> devices;
  uint32_t local_9c;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_98;
  OclThreads local_80;
  pointer local_68;
  pointer local_60;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_58;
  OclPlatform local_40;
  
  if (this->m_enabled == true) {
    String::String((String *)&local_80,"cn/blur");
    cVar2 = std::
            _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
            ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
                    *)&this->m_threads,(String *)&local_80);
    if (local_80.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete__(local_80.m_data.
                        super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    }
    if (((_Rb_tree_header *)cVar2._M_node ==
         &(this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header) &&
       (iVar1 = OclLib::init((EVP_PKEY_CTX *)(this->m_loader).m_data), (char)iVar1 != '\0')) {
      local_60 = (this->m_devicesHint).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_68 = (this->m_devicesHint).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_60 == local_68) {
        local_80.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
        _M_impl.super__Vector_impl_data._0_16_ = platform(this);
        OclPlatform::devices(&local_98,(OclPlatform *)&local_80);
      }
      else {
        local_40 = platform(this);
        OclPlatform::devices(&local_58,&local_40);
        local_98.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar5 = ((long)local_58.
                       super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        __n = (long)(this->m_devicesHint).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_devicesHint).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
        if (uVar5 <= __n) {
          __n = uVar5;
        }
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::reserve(&local_98,__n);
        if (local_58.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
            .super__Vector_impl_data._M_start !=
            local_58.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          __args = local_58.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            local_9c = __args->m_index;
            _Var3 = std::
                    __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                              ((this->m_devicesHint).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (this->m_devicesHint).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_9c);
            if (_Var3._M_current !=
                (this->m_devicesHint).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>>::
              emplace_back<xmrig::OclDevice_const&>
                        ((vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>> *)&local_98,
                         __args);
            }
            __args = __args + 1;
          } while (__args != local_58.
                             super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      if (local_60 != local_68) {
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_58);
      }
      if (local_98.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        OclThreads::OclThreads(&local_80,&local_98);
        sVar4 = Threads<xmrig::OclThreads>::move(&this->m_threads,"cn/blur",&local_80);
        std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::~vector(&local_80.m_data);
        this->m_shouldSave = sVar4 != 0;
      }
      std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_98);
    }
  }
  return;
}

Assistant:

void xmrig::OclConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!OclLib::init(loader())) {
        return;
    }

    const auto devices = m_devicesHint.empty() ? platform().devices() : filterDevices(platform().devices(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, devices);

    m_shouldSave = count > 0;
}